

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void dateFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  DateTime x;
  char zBuf [100];
  DateTime DStack_a8;
  char local_78 [104];
  
  iVar1 = isDate(context,argc,argv,&DStack_a8);
  if (iVar1 == 0) {
    computeYMD(&DStack_a8);
    sqlite3_snprintf(100,local_78,"%04d-%02d-%02d",(ulong)(uint)DStack_a8.Y,(ulong)(uint)DStack_a8.M
                     ,(ulong)(uint)DStack_a8.D);
    setResultStrOrError(context,local_78,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  return;
}

Assistant:

static void dateFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    char zBuf[100];
    computeYMD(&x);
    sqlite3_snprintf(sizeof(zBuf), zBuf, "%04d-%02d-%02d", x.Y, x.M, x.D);
    sqlite3_result_text(context, zBuf, -1, SQLITE_TRANSIENT);
  }
}